

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# player.c
# Opt level: O2

void player_safe_name(char *safe,size_t safelen,char *name,_Bool strip_suffix)

{
  byte bVar1;
  byte bVar2;
  char *pcVar3;
  ushort **ppuVar4;
  char *pcVar5;
  
  if (name == (char *)0x0) {
    pcVar3 = (char *)0x0;
  }
  else {
    pcVar3 = find_roman_suffix_start(name);
    if (pcVar3 == (char *)0x0) {
      pcVar3 = (char *)strlen(name);
    }
    else {
      pcVar3 = pcVar3 + ~(ulong)name;
    }
  }
  if (safelen <= pcVar3) {
    pcVar3 = (char *)safelen;
  }
  for (pcVar5 = (char *)0x0; pcVar3 != pcVar5; pcVar5 = pcVar5 + 1) {
    bVar1 = name[(long)pcVar5];
    ppuVar4 = __ctype_b_loc();
    bVar2 = 0x5f;
    if (((*ppuVar4)[bVar1] & 0xc00) != 0) {
      bVar2 = bVar1;
    }
    safe[(long)pcVar5] = bVar2;
  }
  safe[(long)pcVar3] = '\0';
  if (*safe != '\0') {
    return;
  }
  my_strcpy(safe,"PLAYER",safelen);
  return;
}

Assistant:

void player_safe_name(char *safe, size_t safelen, const char *name, bool strip_suffix)
{
	size_t i;
	size_t limit = 0;

	if (name) {
		char *suffix = find_roman_suffix_start(name);

		if (suffix) {
			limit = suffix - name - 1; /* -1 for preceding space */
		} else {
			limit = strlen(name);
		}
	}

	/* Limit to maximum size of safename buffer */
	limit = MIN(limit, safelen);

	for (i = 0; i < limit; i++) {
		char c = name[i];

		/* Convert all non-alphanumeric symbols */
		if (!isalpha((unsigned char)c) && !isdigit((unsigned char)c))
			c = '_';

		/* Build "base_name" */
		safe[i] = c;
	}

	/* Terminate */
	safe[i] = '\0';

	/* Require a "base" name */
	if (!safe[0])
		my_strcpy(safe, "PLAYER", safelen);
}